

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::Viterbi::forwardbackward(Lattice *lattice)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int pos_1;
  int pos;
  long lVar11;
  int pos_2;
  long *plVar12;
  float extraout_XMM0_Da;
  float fVar13;
  long lVar9;
  long lVar10;
  
  iVar6 = (*lattice->_vptr_Lattice[0x12])(lattice,8);
  if ((char)iVar6 != '\0') {
    iVar6 = (*lattice->_vptr_Lattice[5])(lattice);
    iVar7 = (*lattice->_vptr_Lattice[4])(lattice);
    lVar9 = CONCAT44(extraout_var_00,iVar7);
    uVar8 = (*lattice->_vptr_Lattice[0xb])(lattice);
    lVar10 = CONCAT44(extraout_var_01,uVar8);
    (*lattice->_vptr_Lattice[0xf])(lattice);
    *(undefined4 *)(*(long *)CONCAT44(extraout_var,iVar6) + 0x54) = 0;
    dVar3 = (double)extraout_XMM0_Da;
    for (lVar11 = 0; lVar11 <= lVar10; lVar11 = lVar11 + 1) {
      plVar12 = (long *)(lVar9 + lVar11 * 8);
      while (lVar1 = *plVar12, lVar1 != 0) {
        *(undefined4 *)(lVar1 + 0x54) = 0;
        fVar13 = 0.0;
        plVar12 = (long *)(lVar1 + 0x28);
        while (lVar2 = *plVar12, lVar2 != 0) {
          dVar4 = logsumexp((double)fVar13,
                            (double)*(int *)(lVar2 + 0x20) * -dVar3 +
                            (double)*(float *)(*(long *)(lVar2 + 0x10) + 0x54),
                            lVar2 == *(long *)(lVar1 + 0x28));
          fVar13 = (float)dVar4;
          *(float *)(lVar1 + 0x54) = fVar13;
          plVar12 = (long *)(lVar2 + 0x18);
        }
        plVar12 = (long *)(lVar1 + 0x18);
      }
    }
    *(undefined4 *)(*(long *)(lVar9 + lVar10 * 8) + 0x58) = 0;
    for (; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      plVar12 = (long *)CONCAT44(extraout_var,iVar6) + uVar8;
      while (lVar11 = *plVar12, lVar11 != 0) {
        *(undefined4 *)(lVar11 + 0x58) = 0;
        fVar13 = 0.0;
        for (plVar12 = (long *)(lVar11 + 0x20); plVar12 = (long *)*plVar12, plVar12 != (long *)0x0;
            plVar12 = plVar12 + 1) {
          dVar4 = logsumexp((double)fVar13,
                            (double)(int)plVar12[4] * -dVar3 + (double)*(float *)(*plVar12 + 0x58),
                            plVar12 == *(long **)(lVar11 + 0x20));
          fVar13 = (float)dVar4;
          *(float *)(lVar11 + 0x58) = fVar13;
        }
        plVar12 = (long *)(lVar11 + 0x10);
      }
    }
    dVar4 = (double)*(float *)(*(long *)(lVar9 + lVar10 * 8) + 0x54);
    (*lattice->_vptr_Lattice[0xc])();
    for (lVar11 = 0; lVar11 <= lVar10; lVar11 = lVar11 + 1) {
      plVar12 = (long *)(lVar9 + lVar11 * 8);
      while (lVar1 = *plVar12, lVar1 != 0) {
        dVar5 = exp((double)(*(float *)(lVar1 + 0x54) + *(float *)(lVar1 + 0x58)) - dVar4);
        *(float *)(lVar1 + 0x5c) = (float)dVar5;
        for (plVar12 = (long *)(lVar1 + 0x28); plVar12 = (long *)*plVar12, plVar12 != (long *)0x0;
            plVar12 = plVar12 + 3) {
          dVar5 = exp(((double)*(float *)(*plVar12 + 0x58) +
                      (double)(int)plVar12[4] * -dVar3 + (double)*(float *)(plVar12[2] + 0x54)) -
                      dVar4);
          *(float *)((long)plVar12 + 0x24) = (float)dVar5;
        }
        plVar12 = (long *)(lVar1 + 0x18);
      }
    }
  }
  return true;
}

Assistant:

bool Viterbi::forwardbackward(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_MARGINAL_PROB)) {
    return true;
  }

  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();

  const size_t len = lattice->size();
  const double theta = lattice->theta();

  end_node_list[0]->alpha = 0.0;
  for (int pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      calc_alpha(node, theta);
    }
  }

  begin_node_list[len]->beta = 0.0;
  for (int pos = static_cast<long>(len); pos >= 0; --pos) {
    for (Node *node = end_node_list[pos]; node; node = node->enext) {
      calc_beta(node, theta);
    }
  }

  const double Z = begin_node_list[len]->alpha;
  lattice->set_Z(Z);  // alpha of EOS

  for (int pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      node->prob = std::exp(node->alpha + node->beta - Z);
      for (Path *path = node->lpath; path; path = path->lnext) {
        path->prob = std::exp(path->lnode->alpha
                              - theta * path->cost
                              + path->rnode->beta - Z);
      }
    }
  }

  return true;
}